

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O2

int onig_st_lookup(st_table *table,st_data_t key,st_data_t *value)

{
  uint uVar1;
  int iVar2;
  st_table_entry *psVar3;
  st_table_entry *psVar4;
  
  uVar1 = (*table->type->hash)(key);
  psVar4 = table->bins[(ulong)uVar1 % (ulong)(uint)table->num_bins];
  if (psVar4 == (st_table_entry *)0x0) {
    return 0;
  }
  if ((psVar4->hash != uVar1) ||
     ((psVar4->key != key && (iVar2 = (*table->type->compare)(key,psVar4->key), iVar2 != 0)))) {
    do {
      do {
        psVar3 = psVar4;
        psVar4 = psVar3->next;
        if (psVar4 == (st_table_entry *)0x0) {
          return 0;
        }
      } while (psVar4->hash != uVar1);
      if (psVar4->key == key) goto LAB_0012956f;
      iVar2 = (*table->type->compare)(key,psVar4->key);
      psVar4 = psVar3->next;
    } while (iVar2 != 0);
    if (psVar4 == (st_table_entry *)0x0) {
      return 0;
    }
  }
LAB_0012956f:
  if (value != (st_data_t *)0x0) {
    *value = psVar4->record;
  }
  return 1;
}

Assistant:

extern int
st_lookup(st_table* table, register st_data_t key, st_data_t* value)
{
  unsigned int hash_val, bin_pos;
  register st_table_entry *ptr;

  hash_val = do_hash(key, table);
  FIND_ENTRY(table, ptr, hash_val, bin_pos);

  if (ptr == 0) {
    return 0;
  }
  else {
    if (value != 0)  *value = ptr->record;
    return 1;
  }
}